

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O3

void __thiscall
BSDFEnergyConservation_LambertianReflection_Test::TestBody
          (BSDFEnergyConservation_LambertianReflection_Test *this)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<pbrt::BSDF_*(const_pbrt::SurfaceInteraction_&,_pstd::pmr::polymorphic_allocator<std::byte>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bsdfs_test.cpp:520:9)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<pbrt::BSDF_*(const_pbrt::SurfaceInteraction_&,_pstd::pmr::polymorphic_allocator<std::byte>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bsdfs_test.cpp:520:9)>
             ::_M_manager;
  TestEnergyConservation
            ((function<pbrt::BSDF_*(const_pbrt::SurfaceInteraction_&,_pstd::pmr::polymorphic_allocator<std::byte>)>
              *)&local_28,"LambertianReflection");
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

void DumpTables(const Float* frequencies, const Float* expFrequencies, int thetaRes,
                int phiRes, const char* filename) {
    std::ofstream f(filename);

    f << "frequencies = [ ";
    for (int i = 0; i < thetaRes; ++i) {
        for (int j = 0; j < phiRes; ++j) {
            f << frequencies[i * phiRes + j];
            if (j + 1 < phiRes)
                f << ", ";
        }
        if (i + 1 < thetaRes)
            f << "; ";
    }
    f << " ];" << std::endl << "expFrequencies = [ ";
    for (int i = 0; i < thetaRes; ++i) {
        for (int j = 0; j < phiRes; ++j) {
            f << expFrequencies[i * phiRes + j];
            if (j + 1 < phiRes)
                f << ", ";
        }
        if (i + 1 < thetaRes)
            f << "; ";
    }
    f << " ];" << std::endl
      << "colormap(jet);" << std::endl
      << "clf; subplot(2,1,1);" << std::endl
      << "imagesc(frequencies);" << std::endl
      << "title('Observed frequencies');" << std::endl
      << "axis equal;" << std::endl
      << "subplot(2,1,2);" << std::endl
      << "imagesc(expFrequencies);" << std::endl
      << "axis equal;" << std::endl
      << "title('Expected frequencies');" << std::endl;
    f.close();
}